

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O2

void ImGui::SFML::ProcessEvent(Event *event)

{
  uint uVar1;
  ImGuiIO *pIVar2;
  EventType EVar3;
  ulong uVar4;
  long lVar5;
  
  if ((anonymous_namespace)::s_currWindowCtx == 0) {
    __assert_fail("s_currWindowCtx && \"No current window is set - forgot to call ImGui::SFML::Init?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-sfml-src/imgui-SFML.cpp"
                  ,0x150,"void ImGui::SFML::ProcessEvent(const sf::Event &)");
  }
  if (*(char *)((anonymous_namespace)::s_currWindowCtx + 0x38) == '\x01') {
    pIVar2 = GetIO();
    lVar5 = (anonymous_namespace)::s_currWindowCtx;
    EVar3 = event->type;
    switch(EVar3) {
    case TextEntered:
      uVar1 = (event->field_1).size.width;
      if (uVar1 != 0x7f && 0x1f < uVar1) {
        ImGuiIO::AddInputCharacter(pIVar2,uVar1);
      }
      break;
    case KeyPressed:
    case KeyReleased:
      uVar4 = (ulong)(event->field_1).size.width;
      if (uVar4 < 0x285) {
        pIVar2->KeysDown[uVar4] = EVar3 == KeyPressed;
      }
      pIVar2->KeyCtrl = (event->field_1).key.control;
      pIVar2->KeyAlt = (event->field_1).key.alt;
      pIVar2->KeyShift = (event->field_1).key.shift;
      pIVar2->KeySuper = (event->field_1).key.system;
      break;
    default:
      goto switchD_0013c682_caseD_7;
    case MouseWheelScrolled:
      uVar1 = (event->field_1).size.width;
      if (uVar1 != 0) {
        if (uVar1 != 1) {
          return;
        }
        if (pIVar2->KeyShift != true) {
          pIVar2->MouseWheelH = (event->field_1).mouseWheelScroll.delta + pIVar2->MouseWheelH;
          break;
        }
      }
      pIVar2->MouseWheel = (event->field_1).mouseWheelScroll.delta + pIVar2->MouseWheel;
      break;
    case MouseButtonPressed:
    case MouseButtonReleased:
      uVar1 = (event->field_1).size.width;
      if (uVar1 < 3 && EVar3 == MouseButtonPressed) {
        *(undefined1 *)((anonymous_namespace)::s_currWindowCtx + 0x3a + (ulong)uVar1) = 1;
      }
      break;
    case MouseMoved:
      *(undefined1 *)((anonymous_namespace)::s_currWindowCtx + 0x39) = 1;
      return;
    case JoystickConnected:
      if (*(int *)((anonymous_namespace)::s_currWindowCtx + 0x50) == 8) {
        *(uint *)((anonymous_namespace)::s_currWindowCtx + 0x50) = (event->field_1).size.width;
      }
      break;
    case JoystickDisconnected:
      if (*(uint *)((anonymous_namespace)::s_currWindowCtx + 0x50) == (event->field_1).size.width) {
        uVar1 = anon_unknown.dwarf_115aec::getConnectedJoystickId();
        *(uint *)((anonymous_namespace)::s_currWindowCtx + 0x50) = uVar1;
      }
      break;
    case TouchBegan:
    case TouchEnded:
      *(undefined1 *)((anonymous_namespace)::s_currWindowCtx + 0x39) = 0;
      uVar1 = (event->field_1).size.width;
      if (uVar1 < 3 && EVar3 == TouchBegan) {
        *(undefined1 *)(lVar5 + 0x44 + (ulong)uVar1) = 1;
      }
    }
  }
  EVar3 = event->type;
switchD_0013c682_caseD_7:
  if (EVar3 == GainedFocus) {
    *(undefined1 *)((anonymous_namespace)::s_currWindowCtx + 0x38) = 1;
  }
  else if (EVar3 == LostFocus) {
    pIVar2 = GetIO();
    for (lVar5 = -0x285; lVar5 != 0; lVar5 = lVar5 + 1) {
      pIVar2->MouseDown[lVar5 + -0xb] = false;
    }
    pIVar2->KeyCtrl = false;
    pIVar2->KeyShift = false;
    pIVar2->KeyAlt = false;
    pIVar2->KeySuper = false;
    *(undefined1 *)((anonymous_namespace)::s_currWindowCtx + 0x38) = 0;
  }
  return;
}

Assistant:

void ProcessEvent(const sf::Event& event) {
    assert(s_currWindowCtx && "No current window is set - forgot to call ImGui::SFML::Init?");
    if (s_currWindowCtx->windowHasFocus) {
        ImGuiIO& io = ImGui::GetIO();

        switch (event.type) {
        case sf::Event::MouseMoved:
            s_currWindowCtx->mouseMoved = true;
            break;
        case sf::Event::MouseButtonPressed: // fall-through
        case sf::Event::MouseButtonReleased: {
            int button = event.mouseButton.button;
            if (event.type == sf::Event::MouseButtonPressed && button >= 0 && button < 3) {
                s_currWindowCtx->mousePressed[event.mouseButton.button] = true;
            }
        } break;
        case sf::Event::TouchBegan: // fall-through
        case sf::Event::TouchEnded: {
            s_currWindowCtx->mouseMoved = false;
            int button = event.touch.finger;
            if (event.type == sf::Event::TouchBegan && button >= 0 && button < 3) {
                s_currWindowCtx->touchDown[event.touch.finger] = true;
            }
        } break;
        case sf::Event::MouseWheelScrolled:
            if (event.mouseWheelScroll.wheel == sf::Mouse::VerticalWheel ||
                (event.mouseWheelScroll.wheel == sf::Mouse::HorizontalWheel && io.KeyShift)) {
                io.MouseWheel += event.mouseWheelScroll.delta;
            } else if (event.mouseWheelScroll.wheel == sf::Mouse::HorizontalWheel) {
                io.MouseWheelH += event.mouseWheelScroll.delta;
            }
            break;
        case sf::Event::KeyPressed: // fall-through
        case sf::Event::KeyReleased: {
            int key = event.key.code;
            if (key >= 0 && key < IM_ARRAYSIZE(io.KeysDown)) {
                io.KeysDown[key] = (event.type == sf::Event::KeyPressed);
            }
            io.KeyCtrl = event.key.control;
            io.KeyAlt = event.key.alt;
            io.KeyShift = event.key.shift;
            io.KeySuper = event.key.system;
        } break;
        case sf::Event::TextEntered:
            // Don't handle the event for unprintable characters
            if (event.text.unicode < ' ' || event.text.unicode == 127) {
                break;
            }
            io.AddInputCharacter(event.text.unicode);
            break;
        case sf::Event::JoystickConnected:
            if (s_currWindowCtx->joystickId == NULL_JOYSTICK_ID) {
                s_currWindowCtx->joystickId = event.joystickConnect.joystickId;
            }
            break;
        case sf::Event::JoystickDisconnected:
            if (s_currWindowCtx->joystickId == event.joystickConnect.joystickId) { // used gamepad
                                                                                   // was
                                                                                   // disconnected
                s_currWindowCtx->joystickId = getConnectedJoystickId();
            }
            break;
        default:
            break;
        }
    }

    switch (event.type) {
    case sf::Event::LostFocus: {
        // reset all input - SFML doesn't send KeyReleased
        // event when window goes out of focus
        ImGuiIO& io = ImGui::GetIO();
        for (int i = 0; i < IM_ARRAYSIZE(io.KeysDown); ++i) {
            io.KeysDown[i] = false;
        }
        io.KeyCtrl = false;
        io.KeyAlt = false;
        io.KeyShift = false;
        io.KeySuper = false;

        s_currWindowCtx->windowHasFocus = false;
    } break;
    case sf::Event::GainedFocus:
        s_currWindowCtx->windowHasFocus = true;
        break;
    default:
        break;
    }
}